

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O2

Status __thiscall HighsLpRelaxation::resolveLp(HighsLpRelaxation *this,HighsDomain *domain)

{
  double *pdVar1;
  int iVar2;
  CliqueVar CVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pLVar6;
  pointer pdVar7;
  pointer ppVar8;
  pointer pSVar9;
  HighsLp *pHVar10;
  bool bVar11;
  HighsInt j;
  Status SVar12;
  long lVar13;
  ValueType *pVVar14;
  long lVar15;
  pointer pdVar16;
  int *piVar17;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  pair<int,_double> *fracint;
  HighsMipSolver *pHVar22;
  pointer ppVar23;
  bool bVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double local_d0;
  double local_c8;
  HighsInt col;
  undefined4 uStack_b4;
  pointer local_b0;
  Entry *local_a8;
  vector<double,_std::allocator<double>_> *local_a0;
  pointer local_98;
  int *local_90;
  int *local_88;
  vector<double,_std::allocator<double>_> *local_80;
  vector<double,_std::allocator<double>_> *local_78;
  HighsMipSolver *local_70;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *__range4;
  double local_60;
  HighsHashTable<int,_std::pair<double,_int>_> fracints;
  
  ppVar23 = (this->fractionalints).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->fractionalints).
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar23) {
    (this->fractionalints).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar23;
  }
  __range4 = &this->fractionalints;
  local_a0 = &(this->lpsolver).solution_.col_value;
  local_78 = &(this->lpsolver).model_.lp_.col_upper_;
  local_80 = &(this->lpsolver).model_.lp_.col_lower_;
  do {
    if (domain != (HighsDomain *)0x0) {
      flushDomain(this,domain,false);
    }
    SVar12 = run(this,true);
    this->status = SVar12;
    if ((2 < SVar12 - kUnscaledDualFeasible) && (SVar12 != kOptimal)) {
      if (SVar12 == kInfeasible) {
        this->objective = INFINITY;
        return kInfeasible;
      }
      return SVar12;
    }
    HighsHashTable<int,_std::pair<double,_int>_>::HighsHashTable
              (&fracints,(long)this->maxNumFractional);
    _Var18._M_head_impl =
         (this->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    piVar17 = *(int **)&((_Var18._M_head_impl)->integral_cols).
                        super__Vector_base<int,_std::allocator<int>_>;
    local_88 = *(pointer *)((long)&(_Var18._M_head_impl)->integral_cols + 8);
    bVar24 = true;
LAB_002b8a02:
    if (piVar17 != local_88) {
      iVar20 = *piVar17;
      uVar21 = (ulong)iVar20;
      pHVar22 = this->mipsolver;
      dVar26 = (this->lpsolver).model_.lp_.col_upper_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar21];
      dVar28 = (this->lpsolver).solution_.col_value.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar21];
      if (dVar28 <= dVar26) {
        dVar26 = dVar28;
      }
      local_c8 = (this->lpsolver).model_.lp_.col_lower_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar21];
      if (local_c8 <= dVar26) {
        local_c8 = dVar26;
      }
      dVar25 = round(local_c8);
      _Var18._M_head_impl =
           (pHVar22->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      dVar26 = (_Var18._M_head_impl)->feastol;
      if (dVar26 < ABS(local_c8 - dVar25)) {
        if (bVar24) {
          if (*(int *)(*(long *)&((_Var18._M_head_impl)->uplocks).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl + uVar21 * 4)
              == 0) {
            bVar24 = true;
            local_90 = piVar17;
          }
          else {
            bVar24 = *(int *)(*(long *)&((_Var18._M_head_impl)->downlocks).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl +
                             uVar21 * 4) == 0;
            local_90 = piVar17;
          }
        }
        else {
          bVar24 = false;
          local_90 = piVar17;
        }
        do {
          piVar17 = local_90;
          lVar13 = (long)*(int *)(*(long *)&((_Var18._M_head_impl)->cliquetable).colsubstituted.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                 uVar21 * 4);
          col = iVar20;
          if ((lVar13 == 0) ||
             (lVar15 = *(long *)&((_Var18._M_head_impl)->cliquetable).substitutions.
                                 super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                                 ._M_impl, lVar15 + lVar13 * 8 == 8)) goto LAB_002b8c5d;
          lVar15 = lVar15 + lVar13 * 8;
          uVar19 = *(uint *)(lVar15 + -4);
          uVar21 = (ulong)(uVar19 & 0x7fffffff);
          pdVar7 = (local_80->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          dVar26 = pdVar7[uVar21];
          pdVar1 = (local_78->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start + uVar21;
          if ((dVar26 == *pdVar1) && (!NAN(dVar26) && !NAN(*pdVar1))) {
            if (domain == (HighsDomain *)0x0) goto LAB_002b8c5d;
            if (-1 < (int)uVar19) {
              dVar26 = 1.0 - pdVar7[uVar19];
            }
            HighsDomain::fixCol(domain,iVar20,dVar26,(Reason)0xfffffffe);
            if (domain->infeasible_ != false) {
              this->objective = INFINITY;
              this->status = kInfeasible;
              goto LAB_002b8cd2;
            }
            uVar19 = *(uint *)(lVar15 + -4);
            pHVar22 = this->mipsolver;
            uVar21 = (ulong)(uVar19 & 0x7fffffff);
          }
          iVar20 = (int)uVar21;
          if (-1 < (int)uVar19) {
            local_c8 = 1.0 - local_c8;
          }
          _Var18._M_head_impl =
               (pHVar22->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
        } while( true );
      }
      if ((this->lpsolver).basis_.col_status.
          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start[uVar21] != kBasic) {
        dVar25 = *(double *)
                  (*(long *)&(((vector<double,_std::allocator<double>_> *)
                              ((long)&(_Var18._M_head_impl)->domain + 800))->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl +
                  uVar21 * 8) - dVar28;
        dVar28 = dVar28 - *(double *)
                           (*(long *)&(((vector<double,_std::allocator<double>_> *)
                                       ((long)&(_Var18._M_head_impl)->domain + 0x308))->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl +
                           uVar21 * 8);
        if (dVar25 <= dVar28) {
          dVar28 = dVar25;
        }
        if (dVar26 < dVar28) {
          piVar4 = (this->lpsolver).model_.lp_.a_matrix_.start_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          piVar5 = (pHVar22->model_->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar13 = ((long)piVar5[uVar21 + 1] - (long)piVar5[uVar21]) + (long)piVar4[uVar21];
          iVar20 = piVar4[uVar21 + 1];
          if ((int)lVar13 != iVar20) {
            piVar4 = (this->lpsolver).model_.lp_.a_matrix_.index_.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            pLVar6 = (this->lprows).
                     super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pdVar7 = (this->lpsolver).solution_.row_value.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar16 = (this->lpsolver).model_.lp_.row_upper_.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            for (; lVar13 < iVar20; lVar13 = lVar13 + 1) {
              iVar2 = piVar4[lVar13];
              if ((pLVar6[iVar2].age != 0) &&
                 (dVar28 = pdVar16[iVar2] - dVar26, pdVar1 = pdVar7 + iVar2,
                 dVar28 < *pdVar1 || dVar28 == *pdVar1)) {
                pLVar6[iVar2].age = 0;
              }
            }
          }
        }
      }
      goto LAB_002b8cae;
    }
    iVar20 = (int)fracints.numElements;
    if ((int)fracints.numElements < this->maxNumFractional) {
      iVar20 = this->maxNumFractional;
    }
    this->maxNumFractional = iVar20;
    if ((domain == (HighsDomain *)0x0) ||
       (bVar11 = true, local_90 = piVar17,
       (domain->changedcols_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (domain->changedcols_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish)) {
      local_90 = piVar17;
      HighsHashTable<int,_std::pair<double,_int>_>::begin((iterator *)&col,&fracints);
      lVar13 = (long)fracints.metadata._M_t.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
               fracints.tableSizeMask;
      while (CONCAT44(uStack_b4,col) != lVar13 + 1) {
        lVar15 = CONCAT44(uStack_b4,col) - (long)local_b0;
        local_60 = local_a8[lVar15].value_.first / (double)local_a8[lVar15].value_.second;
        std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
        emplace_back<int_const&,double>
                  ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)__range4,
                   &local_a8[lVar15].key_,&local_60);
        HighsHashTable<int,_std::pair<double,_int>_>::
        HashTableIterator<HighsHashTableEntry<int,_std::pair<double,_int>_>_>::operator++
                  ((iterator *)&col);
      }
      if ((bVar24) &&
         ((this->fractionalints).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (this->fractionalints).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish)) {
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&col,local_a0);
        ppVar8 = (this->fractionalints).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pHVar22 = this->mipsolver;
        pdVar7 = (this->lpsolver).model_.lp_.col_lower_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        lVar13 = CONCAT44(uStack_b4,col);
        local_98 = (this->lpsolver).model_.lp_.col_upper_.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
        for (ppVar23 = (this->fractionalints).
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppVar23 != ppVar8;
            ppVar23 = ppVar23 + 1) {
          lVar15 = (long)ppVar23->first;
          _Var18._M_head_impl =
               (pHVar22->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
          if ((*(int *)(*(long *)&((_Var18._M_head_impl)->uplocks).
                                  super__Vector_base<int,_std::allocator<int>_> + lVar15 * 4) != 0)
             || ((pdVar1 = (pHVar22->model_->col_cost_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar15,
                 0.0 < *pdVar1 || *pdVar1 == 0.0 &&
                 (*(int *)(*(long *)&((_Var18._M_head_impl)->downlocks).
                                     super__Vector_base<int,_std::allocator<int>_> + lVar15 * 4) ==
                  0)))) {
            dVar26 = (_Var18._M_head_impl)->feastol;
            dVar27 = floor(ppVar23->second + dVar26);
            dVar28 = pdVar7[lVar15];
            dVar25 = -INFINITY;
            if (-INFINITY < dVar28) {
              dVar25 = ceil(dVar28 - dVar26);
            }
            if (dVar25 <= dVar27) {
              dVar25 = dVar27;
            }
          }
          else {
            dVar26 = (_Var18._M_head_impl)->feastol;
            dVar28 = ceil(ppVar23->second - dVar26);
            dVar25 = INFINITY;
            if (local_98[lVar15] < INFINITY) {
              dVar25 = floor(dVar26 + local_98[lVar15]);
            }
            if (dVar28 <= dVar25) {
              dVar25 = dVar28;
            }
          }
          *(double *)(lVar13 + lVar15 * 8) = dVar25;
        }
        pHVar22 = this->mipsolver;
        _Var18._M_head_impl =
             (pHVar22->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
        pSVar9 = (((vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                    *)((long)&(_Var18._M_head_impl)->cliquetable + 0x118))->
                 super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar13 = CONCAT44(uStack_b4,col);
        uVar21 = (ulong)((long)*(pointer *)((long)&(_Var18._M_head_impl)->cliquetable + 0x120) -
                        (long)pSVar9) >> 3 & 0xffffffff;
        while( true ) {
          uVar21 = uVar21 - 1;
          if ((int)(uint)uVar21 < 0) break;
          uVar19 = (uint)uVar21 & 0x7fffffff;
          CVar3 = pSVar9[uVar19].replace;
          if ((long)(int)CVar3 < 0) {
            dVar26 = *(double *)(lVar13 + (ulong)((uint)CVar3 & 0x7fffffff) * 8);
          }
          else {
            dVar26 = 1.0 - *(double *)(lVar13 + (long)(int)CVar3 * 8);
          }
          *(double *)(lVar13 + (long)pSVar9[uVar19].substcol * 8) = dVar26;
        }
        pHVar10 = pHVar22->model_;
        dVar28 = 0.0;
        dVar26 = 0.0;
        for (uVar21 = 0; (uint)pHVar10->num_col_ != uVar21; uVar21 = uVar21 + 1) {
          dVar25 = *(double *)(CONCAT44(uStack_b4,col) + uVar21 * 8) *
                   (pHVar10->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar21];
          dVar27 = dVar26 + dVar25;
          dVar28 = dVar28 + (dVar26 - (dVar27 - dVar25)) + (dVar25 - (dVar27 - (dVar27 - dVar25)));
          dVar26 = dVar27;
        }
        HighsMipSolverData::addIncumbent
                  (_Var18._M_head_impl,(vector<double,_std::allocator<double>_> *)&col,
                   dVar26 + dVar28,7,true,false);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)&col);
      }
      pHVar10 = this->mipsolver->model_;
      local_c8 = 0.0;
      local_d0 = 0.0;
      for (uVar21 = 0; (uint)pHVar10->num_col_ != uVar21; uVar21 = uVar21 + 1) {
        dVar26 = (this->lpsolver).solution_.col_value.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar21] *
                 (pHVar10->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar21];
        dVar28 = local_c8 + dVar26;
        local_d0 = local_d0 +
                   (local_c8 - (dVar28 - dVar26)) + (dVar26 - (dVar28 - (dVar28 - dVar26)));
        local_c8 = dVar28;
      }
      if ((((this->fractionalints).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            (this->fractionalints).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) && (this->status != kOptimal)) &&
         (this->status != kUnscaledPrimalFeasible)) {
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&col,local_a0);
        local_70 = this->mipsolver;
        pdVar7 = (this->lpsolver).model_.lp_.col_lower_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pHVar10 = local_70->model_;
        uVar19 = pHVar10->num_col_;
        lVar13 = CONCAT44(uStack_b4,col);
        pdVar16 = (this->lpsolver).model_.lp_.col_upper_.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((int)uVar19 < 1) {
          uVar19 = 0;
        }
        local_98 = pdVar16;
        for (uVar21 = 0; uVar19 != uVar21; uVar21 = uVar21 + 1) {
          dVar26 = *(double *)(lVar13 + uVar21 * 8);
          dVar28 = pdVar7[uVar21];
          if ((dVar26 < dVar28) || (dVar28 = pdVar16[uVar21], dVar28 < dVar26)) {
LAB_002b9132:
            *(double *)(lVar13 + uVar21 * 8) = dVar28;
          }
          else if ((pHVar10->integrality_).
                   super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar21] != kContinuous) {
            dVar28 = round(dVar26);
            pdVar16 = local_98;
            goto LAB_002b9132;
          }
        }
        bVar24 = HighsMipSolverData::checkSolution
                           ((local_70->mipdata_)._M_t.
                            super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                            .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl,
                            (vector<double,_std::allocator<double>_> *)&col);
        if (bVar24) {
          std::vector<double,_std::allocator<double>_>::_M_move_assign
                    (local_a0,(_Vector_base<double,_std::allocator<double>_> *)&col);
          this->status = (uint)((this->status - kOptimal & 0xfffffffd) != 0) * 3 + kOptimal;
        }
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)&col);
      }
      this->objective = local_c8 + local_d0;
LAB_002b8cd2:
      bVar11 = false;
    }
    HighsHashTable<int,_std::pair<double,_int>_>::~HighsHashTable(&fracints);
    if (local_90 != local_88) {
      return kInfeasible;
    }
    if (!bVar11) {
      return this->status;
    }
  } while( true );
LAB_002b8c5d:
  if (this->adjustSymBranchingCol == true) {
    col = HighsSymmetries::getBranchingColumn
                    (&(_Var18._M_head_impl)->symmetries,local_80,local_78,iVar20);
  }
  pVVar14 = HighsHashTable<int,_std::pair<double,_int>_>::operator[](&fracints,&col);
  pVVar14->first = local_c8 + pVVar14->first;
  pVVar14->second = pVVar14->second + 1;
LAB_002b8cae:
  piVar17 = piVar17 + 1;
  goto LAB_002b8a02;
}

Assistant:

HighsLpRelaxation::Status HighsLpRelaxation::resolveLp(HighsDomain* domain) {
  fractionalints.clear();

  bool solveagain;
  do {
    solveagain = false;
    if (domain) flushDomain(*domain);
    status = run();

    switch (status) {
      case Status::kUnscaledInfeasible:
      case Status::kUnscaledDualFeasible:
      case Status::kUnscaledPrimalFeasible:
      case Status::kOptimal: {
        HighsHashTable<HighsInt, std::pair<double, int>> fracints(
            maxNumFractional);
        const HighsSolution& sol = lpsolver.getSolution();

        HighsCDouble objsum = 0;
        bool roundable = true;

        for (HighsInt i : mipsolver.mipdata_->integral_cols) {
          // for the fractionality we assume that LP bounds are not violated
          // bounds that are violated by the unscaled LP are indicated by the
          // return status already
          double val = std::max(
              std::min(sol.col_value[i], lpsolver.getLp().col_upper_[i]),
              lpsolver.getLp().col_lower_[i]);

          if (fractionality(val) > mipsolver.mipdata_->feastol) {
            HighsInt col = i;
            roundable = roundable && (mipsolver.mipdata_->uplocks[col] == 0 ||
                                      mipsolver.mipdata_->downlocks[col] == 0);

            const HighsCliqueTable::Substitution* subst =
                mipsolver.mipdata_->cliquetable.getSubstitution(col);
            while (subst != nullptr) {
              if (lpsolver.getLp().col_lower_[subst->replace.col] ==
                  lpsolver.getLp().col_upper_[subst->replace.col]) {
                if (domain) {
                  domain->fixCol(
                      col, subst->replace.weight(lpsolver.getLp().col_lower_));
                  if (domain->infeasible()) {
                    objective = kHighsInf;
                    status = Status::kInfeasible;
                    return status;
                  }
                } else
                  break;
              }

              col = subst->replace.col;
              if (subst->replace.val == 0) val = 1.0 - val;

              subst = mipsolver.mipdata_->cliquetable.getSubstitution(col);
            }

            if (adjustSymBranchingCol)
              col = mipsolver.mipdata_->symmetries.getBranchingColumn(
                  getLp().col_lower_, getLp().col_upper_, col);

            auto& pair = fracints[col];
            pair.first += val;
            pair.second += 1;
          } else {
            if (lpsolver.getBasis().col_status[i] == HighsBasisStatus::kBasic)
              continue;

            const double glb = mipsolver.mipdata_->domain.col_lower_[i];
            const double gub = mipsolver.mipdata_->domain.col_upper_[i];

            if (std::min(gub - sol.col_value[i], sol.col_value[i] - glb) <=
                mipsolver.mipdata_->feastol)
              continue;

            const auto& matrix = lpsolver.getLp().a_matrix_;
            const HighsInt colStart =
                matrix.start_[i] + (mipsolver.model_->a_matrix_.start_[i + 1] -
                                    mipsolver.model_->a_matrix_.start_[i]);
            const HighsInt colEnd = matrix.start_[i + 1];

            // skip further checks if the column has no entry in any cut
            if (colStart == colEnd) continue;

            for (HighsInt j = colStart; j < colEnd; ++j) {
              HighsInt row = matrix.index_[j];
              assert(row >= mipsolver.numRow());

              // age is already zero, so irrelevant whether we reset it
              if (lprows[row].age == 0) continue;

              // check that row has no slack in the current solution
              if (sol.row_value[row] <
                  getLp().row_upper_[row] - mipsolver.mipdata_->feastol)
                continue;

              lprows[row].age = 0;
            }
          }
        }

        maxNumFractional =
            std::max((HighsInt)fracints.size(), maxNumFractional);

        if (domain && !domain->getChangedCols().empty()) {
          // printf("resolving due to fixings of substituted columns\n");
          solveagain = true;
          continue;
        }

        for (const auto& it : fracints) {
          fractionalints.emplace_back(
              it.key(), it.value().first / (double)it.value().second);
        }

        if (roundable && !fractionalints.empty()) {
          std::vector<double> roundsol = sol.col_value;

          for (const std::pair<HighsInt, double>& fracint : fractionalints) {
            // get column index
            HighsInt col = fracint.first;
            // round based on locks and sign of objective coefficient
            if (mipsolver.mipdata_->uplocks[col] == 0 &&
                (mipsolver.colCost(col) < 0 ||
                 mipsolver.mipdata_->downlocks[col] != 0)) {
              // round up
              roundsol[col] = std::min(
                  std::ceil(fracint.second - mipsolver.mipdata_->feastol),
                  lpsolver.getLp().col_upper_[col] == kHighsInf
                      ? kHighsInf
                      : std::floor(lpsolver.getLp().col_upper_[col] +
                                   mipsolver.mipdata_->feastol));
            } else {
              // round down
              roundsol[col] = std::max(
                  std::floor(fracint.second + mipsolver.mipdata_->feastol),
                  lpsolver.getLp().col_lower_[col] == -kHighsInf
                      ? -kHighsInf
                      : std::ceil(lpsolver.getLp().col_lower_[col] -
                                  mipsolver.mipdata_->feastol));
            }
          }

          const auto& cliquesubst =
              mipsolver.mipdata_->cliquetable.getSubstitutions();
          for (HighsInt k = cliquesubst.size() - 1; k >= 0; --k) {
            if (cliquesubst[k].replace.val == 0)
              roundsol[cliquesubst[k].substcol] =
                  1 - roundsol[cliquesubst[k].replace.col];
            else
              roundsol[cliquesubst[k].substcol] =
                  roundsol[cliquesubst[k].replace.col];
          }

          for (HighsInt i = 0; i != mipsolver.numCol(); ++i)
            objsum += roundsol[i] * mipsolver.colCost(i);

          mipsolver.mipdata_->addIncumbent(roundsol, double(objsum),
                                           kSolutionSourceSolveLp);
          objsum = 0;
        }

        for (HighsInt i = 0; i != mipsolver.numCol(); ++i)
          objsum += sol.col_value[i] * mipsolver.colCost(i);

        if (fractionalints.empty() && !unscaledPrimalFeasible(status)) {
          std::vector<double> fixSol = sol.col_value;
          for (HighsInt i = 0; i < mipsolver.numCol(); ++i) {
            if (fixSol[i] < lpsolver.getLp().col_lower_[i])
              fixSol[i] = lpsolver.getLp().col_lower_[i];
            else if (fixSol[i] > lpsolver.getLp().col_upper_[i])
              fixSol[i] = lpsolver.getLp().col_upper_[i];
            else if (mipsolver.variableType(i) != HighsVarType::kContinuous)
              fixSol[i] = std::round(fixSol[i]);
          }

          if (mipsolver.mipdata_->checkSolution(fixSol)) {
            const_cast<std::vector<double>&>(sol.col_value) = std::move(fixSol);
            if (unscaledDualFeasible(status))
              status = Status::kOptimal;
            else
              status = Status::kUnscaledPrimalFeasible;
          }
        }

        objective = double(objsum);
        break;
      }
      case Status::kInfeasible:
        objective = kHighsInf;
        break;
      default:
        break;
    }
  } while (solveagain);

  return status;
}